

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::User::User(User *this,User *param_1)

{
  field<discordpp::Snowflake>::field(&this->id,&param_1->id);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->username,&param_1->username);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->discriminator,&param_1->discriminator);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  nullable_field(&this->avatar,&param_1->avatar);
  omittable_field<bool>::omittable_field(&this->bot,&param_1->bot);
  omittable_field<bool>::omittable_field(&this->system,&param_1->system);
  omittable_field<bool>::omittable_field(&this->mfa_enabled,&param_1->mfa_enabled);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->banner,&param_1->banner);
  nullable_omittable_field<int>::nullable_omittable_field
            (&this->accent_color,&param_1->accent_color);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->locale,&param_1->locale);
  omittable_field<bool>::omittable_field(&this->verified,&param_1->verified);
  nullable_omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::nullable_omittable_field(&this->email,&param_1->email);
  omittable_field<int>::omittable_field(&this->flags,&param_1->flags);
  omittable_field<int>::omittable_field(&this->premium_type,&param_1->premium_type);
  omittable_field<int>::omittable_field(&this->public_flags,&param_1->public_flags);
  return;
}

Assistant:

User(
        field<Snowflake> id = uninitialized,
        field<std::string> username = uninitialized,
        field<std::string> discriminator = uninitialized,
        nullable_field<std::string> avatar = uninitialized,
        omittable_field<bool> bot = omitted,
        omittable_field<bool> system = omitted,
        omittable_field<bool> mfa_enabled = omitted,
        nullable_omittable_field<std::string> banner = omitted,
        nullable_omittable_field<int> accent_color = omitted,
        omittable_field<std::string> locale = omitted,
        omittable_field<bool> verified = omitted,
        nullable_omittable_field<std::string> email = omitted,
        omittable_field<int> flags = omitted,
        omittable_field<int> premium_type = omitted,
        omittable_field<int> public_flags = omitted
    ):
        id(id),
        username(username),
        discriminator(discriminator),
        avatar(avatar),
        bot(bot),
        system(system),
        mfa_enabled(mfa_enabled),
        banner(banner),
        accent_color(accent_color),
        locale(locale),
        verified(verified),
        email(email),
        flags(flags),
        premium_type(premium_type),
        public_flags(public_flags)
    {}